

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetRemoveOneFanin(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  Wln_Ntk_t *pWVar6;
  Wln_Vec_t *pWVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if ((-1 < iObj) && (iVar1 = (p->vFanins).nSize, iObj < iVar1)) {
    piVar5 = (p->vFanins).pArray;
    iVar2 = piVar5[(uint)iObj];
    if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_00364322:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    pWVar6 = p->pNtk;
    pWVar7 = pWVar6->vFanins;
    if (pWVar7[(uint)iObj].nSize < 1) {
      uVar10 = 0xffffffff;
    }
    else {
      piVar11 = piVar5 + 1;
      uVar10 = 0xffffffff;
      lVar13 = 0;
      do {
        iVar1 = (p->vFanins).nSize;
        if (iVar1 <= iObj) goto LAB_00364303;
        lVar12 = (long)piVar5[(uint)iObj];
        if ((lVar12 < 0) || (iVar1 <= piVar5[(uint)iObj])) goto LAB_00364322;
        iVar1 = piVar11[lVar12 + -1];
        lVar14 = (long)iVar1;
        uVar4 = uVar10;
        if (lVar14 != 0) {
          if (pWVar7[lVar14].nSize == 0) {
            if ((iVar1 < 0) || ((pWVar6->vTypes).nSize <= iVar1)) goto LAB_00364303;
            if ((pWVar6->vTypes).pArray[lVar14] != 3) goto LAB_003642da;
          }
          if ((pWVar6->vTypes).nSize <= iObj) goto LAB_00364303;
          piVar8 = (pWVar6->vTypes).pArray;
          if ((lVar13 == 0) || (piVar8[(uint)iObj] != 0x59)) {
            uVar3 = piVar11[lVar12];
            if ((ulong)uVar3 == 0) {
              __assert_fail("pLink[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                            ,0x1b0,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
            }
            if ((((int)uVar3 < -1) || ((p->vEdgeLinks).nSize <= (int)(uVar3 + 1))) ||
               (uVar3 == 0xffffffff)) goto LAB_00364303;
            piVar9 = (p->vEdgeLinks).pArray;
            uVar4 = piVar9[uVar3 + 1];
            piVar11[iVar2] = piVar9[uVar3];
            if (((int)uVar4 < 0) || ((pWVar6->vTypes).nSize <= (int)uVar4)) goto LAB_00364303;
            if (piVar8[uVar4] != 0x59) {
              __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                            ,0x1b3,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
            }
            if (uVar10 != 0xffffffff) {
              uVar4 = uVar10;
            }
          }
        }
LAB_003642da:
        uVar10 = uVar4;
        lVar13 = lVar13 + 1;
        piVar11 = piVar11 + 2;
      } while (lVar13 < pWVar7[(uint)iObj].nSize);
    }
    return uVar10;
  }
LAB_00364303:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_RetRemoveOneFanin( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        assert( pLink[0] );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pFanins[2*k+1] = Vec_IntEntry( &p->vEdgeLinks, pLink[0] );
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}